

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::sendUpdatedExecRequest
          (TimeCoordinator *this,GlobalFederateId target,GlobalFederateId minFed,
          int32_t responseSequenceCounter)

{
  bool bVar1;
  reference pDVar2;
  int32_t in_ECX;
  BaseType in_EDX;
  long in_RDI;
  DependencyInfo *dep;
  iterator __end2;
  iterator __begin2;
  TimeDependencies *__range2;
  ActionMessage execreq;
  DependencyInfo *mfed;
  undefined4 in_stack_fffffffffffffeb8;
  int32_t in_stack_fffffffffffffebc;
  iterator in_stack_fffffffffffffec0;
  ActionMessage *in_stack_fffffffffffffee0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_100;
  long local_f8;
  ConnectionType in_stack_ffffffffffffff17;
  TimeDependencies *in_stack_ffffffffffffff18;
  GlobalFederateId in_stack_ffffffffffffff20;
  GlobalFederateId in_stack_ffffffffffffff24;
  GlobalFederateId local_28;
  undefined4 local_24;
  DependencyInfo *local_20;
  int32_t local_14;
  GlobalFederateId local_8;
  GlobalFederateId local_4;
  
  local_14 = in_ECX;
  local_8.gid = in_EDX;
  bVar1 = GlobalFederateId::isValid(&local_8);
  if (!bVar1) {
    in_stack_fffffffffffffee0 = (ActionMessage *)(in_RDI + 8);
    local_24 = *(undefined4 *)(in_RDI + 0x48);
    memset(&local_28,0,4);
    GlobalFederateId::GlobalFederateId(&local_28);
    local_20 = getExecEntryMinFederate
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff24,
                          in_stack_ffffffffffffff17,in_stack_ffffffffffffff20);
    local_8.gid = (local_20->fedID).gid;
    local_14 = (local_20->super_TimeData).sequenceCounter;
  }
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffee0,(action_t)((ulong)&stack0xffffffffffffff20 >> 0x20));
  setIterationFlags((ActionMessage *)in_stack_fffffffffffffec0._M_current,
                    (IterationRequest)((uint)in_stack_fffffffffffffebc >> 0x18));
  GlobalFederateId::baseValue(&local_8);
  ActionMessage::setExtraData
            ((ActionMessage *)in_stack_fffffffffffffec0._M_current,in_stack_fffffffffffffebc);
  if ((*(byte *)(in_RDI + 0x250) & 1) != 0) {
    setActionFlag<helics::ActionMessage,helics::TimingFlags>
              ((ActionMessage *)&stack0xffffffffffffff20,delayed_timing_flag);
  }
  bVar1 = GlobalFederateId::isValid(&local_4);
  if (bVar1) {
    ActionMessage::setExtraDestData
              ((ActionMessage *)in_stack_fffffffffffffec0._M_current,in_stack_fffffffffffffebc);
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)
               in_stack_fffffffffffffec0._M_current,
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  else {
    local_f8 = in_RDI + 8;
    local_100._M_current =
         (DependencyInfo *)
         TimeDependencies::begin
                   ((TimeDependencies *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    in_stack_fffffffffffffec0 =
         TimeDependencies::end
                   ((TimeDependencies *)
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    while (bVar1 = __gnu_cxx::
                   operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_fffffffffffffec0._M_current,
                              (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator*(&local_100);
      if (((pDVar2->dependent & 1U) != 0) && ((pDVar2->super_TimeData).mTimeState < time_granted)) {
        ActionMessage::setExtraDestData
                  ((ActionMessage *)in_stack_fffffffffffffec0._M_current,in_stack_fffffffffffffebc);
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)
                   in_stack_fffffffffffffec0._M_current,
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
      ::operator++(&local_100);
    }
  }
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffec0._M_current);
  return;
}

Assistant:

void TimeCoordinator::sendUpdatedExecRequest(GlobalFederateId target,
                                             GlobalFederateId minFed,
                                             std::int32_t responseSequenceCounter)
{
    if (!minFed.isValid()) {
        const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
        minFed = mfed.fedID;
        responseSequenceCounter = mfed.sequenceCounter;
    }

    ActionMessage execreq(CMD_EXEC_REQUEST);
    execreq.source_id = mSourceId;
    setIterationFlags(execreq, iterating);
    execreq.counter = sequenceCounter;
    execreq.setExtraData(minFed.baseValue());

    execreq.messageID = currentRestrictionLevel;
    if (info.wait_for_current_time_updates) {
        setActionFlag(execreq, delayed_timing_flag);
    }
    if (target.isValid()) {
        execreq.dest_id = target;
        execreq.setExtraDestData(responseSequenceCounter);
        sendMessageFunction(execreq);
    } else {
        for (const auto& dep : dependencies) {
            if (dep.dependent && dep.mTimeState < TimeState::time_granted) {
                execreq.dest_id = dep.fedID;
                execreq.setExtraDestData(dep.sequenceCounter);
                sendMessageFunction(execreq);
            }
        }
    }
}